

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O1

void Bmc_PerformICheck(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fEmpty,int fVerbose)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *pCnf;
  lit *begin;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  int *piVar9;
  uint *__ptr;
  void *pvVar10;
  sat_solver *s;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  timespec ts;
  uint local_b0;
  long local_70;
  timespec local_50;
  size_t local_40;
  ulong local_38;
  
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    local_70 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_70 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xce,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xcf,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (fVerbose != 0) {
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",p->pName,
           (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  }
  pGVar8 = Gia_ManDup(p);
  uVar17 = 0;
  p_00 = Gia_ManMiter(p,pGVar8,0,1,1,0,0);
  Gia_ManStop(pGVar8);
  if (p_00->vCos->nSize - p_00->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xd9,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (p_00->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xda,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  piVar9 = (int *)0x0;
  pGVar8 = Jf_ManDeriveCnf(p_00,0);
  Gia_ManStop(p_00);
  pCnf = (Cnf_Dat_t *)pGVar8->pData;
  pGVar8->pData = (void *)0x0;
  iVar5 = p->vCos->nSize;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar16 = iVar5;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar16;
  if (iVar16 != 0) {
    piVar9 = (int *)malloc((long)iVar16 << 2);
  }
  p_01->pArray = piVar9;
  if (0 < p->nRegs) {
    if (1 < (uint)fEmpty) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    iVar16 = 0;
    iVar5 = fEmpty;
    do {
      Vec_IntPush(p_01,iVar5);
      iVar16 = iVar16 + 1;
      iVar5 = iVar5 + 2;
    } while (iVar16 < p->nRegs);
  }
  local_b0 = 0;
  if (fEmpty == 0) {
    local_b0 = p_01->nSize;
  }
  uVar1 = p_01->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  __ptr[1] = 0;
  *__ptr = uVar7;
  if (uVar7 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc((long)(int)uVar7 << 2);
  }
  *(void **)(__ptr + 2) = pvVar10;
  __size = (long)(int)uVar1 * 4;
  local_40 = (ulong)uVar1 * 4;
  do {
    s = Bmc_DeriveSolver(p,pGVar8,pCnf,nFramesMax,nTimeOut,(int)uVar17);
    begin = p_01->pArray;
    uVar17 = 0;
    iVar5 = sat_solver_solve(s,begin,begin + (int)uVar1,0,0,0,0);
    if (iVar5 == -1) {
      piVar9 = (s->conf_final).ptr;
      uVar7 = (s->conf_final).size;
      if ((int)*__ptr < (int)uVar1) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar10 = malloc(__size);
        }
        else {
          pvVar10 = realloc(*(void **)(__ptr + 2),__size);
        }
        *(void **)(__ptr + 2) = pvVar10;
        if (pvVar10 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *__ptr = uVar1;
      }
      if (0 < (int)uVar1) {
        memset(*(void **)(__ptr + 2),0,local_40);
      }
      __ptr[1] = uVar1;
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          uVar13 = piVar9[uVar11];
          if ((int)uVar13 < 0) goto LAB_0059641a;
          uVar13 = uVar13 >> 1;
          if ((int)uVar1 <= (int)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(__ptr + 2) + (ulong)uVar13 * 4) = 1;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          uVar7 = begin[uVar12];
          if ((int)uVar7 < 0) {
LAB_0059641a:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (uVar12 != uVar7 >> 1) {
            __assert_fail("i == Abc_Lit2Var(Lit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                          ,0x109,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
          }
          if (((uVar7 & 1) == 0) && (*(int *)(*(long *)(__ptr + 2) + uVar12 * 4) == 0)) {
            begin[uVar12] = uVar7 | 1;
            local_b0 = local_b0 - 1;
            uVar11 = 1;
          }
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
        uVar11 = (ulong)((int)uVar11 != 0);
      }
      if (fVerbose != 0) {
        iVar5 = pGVar8->vCos->nSize;
        iVar16 = pGVar8->vCis->nSize;
        iVar2 = pGVar8->nObjs;
        iVar3 = p->vCos->nSize;
        iVar4 = p->nRegs;
        local_38 = uVar11;
        iVar6 = sat_solver_nvars(s);
        uVar7 = sat_solver_nconflicts(s);
        uVar17 = (ulong)local_b0;
        printf("M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
               ((double)(int)local_b0 * 100.0) / (double)p->nRegs,
               CONCAT44(in_register_00000034,nFramesMax),
               (ulong)(uint)((~(iVar5 + iVar16) + iVar2) * (nFramesMax + 1)),
               (ulong)(uint)(iVar3 + iVar4 + iVar6),(ulong)uVar7);
        iVar16 = 3;
        iVar5 = clock_gettime(3,&local_50);
        if (iVar5 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        Abc_Print(iVar16,"%s =","Time");
        Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar14 + local_70) / 1000000.0);
        uVar11 = local_38;
      }
      sat_solver_delete(s);
      bVar15 = fEmpty == 0 & (byte)uVar11;
    }
    else if (iVar5 == 1) {
      puts("The problem is satisfiable (the current set is not M-inductive).");
      bVar15 = 0;
    }
    else {
      if (iVar5 != 0) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0xfe,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
      }
      bVar15 = 0;
      printf("Timeout reached after %d seconds.\n",(ulong)(uint)nTimeOut);
    }
    if (bVar15 == 0) {
      Cnf_DataFree(pCnf);
      Gia_ManStop(pGVar8);
      if (begin != (lit *)0x0) {
        free(begin);
        p_01->pArray = (int *)0x0;
      }
      free(p_01);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Bmc_PerformICheck( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fEmpty, int fVerbose )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits, * vUsed;
    int i, status, Lit;
    int nLitsUsed, nLits, * pLits;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p) );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        Gia_ManStop( pTemp );
        pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
    }

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, fEmpty) );

    // iteratively compute a minimal M-inductive set of next-state functions
    nLitsUsed = fEmpty ? 0 : Vec_IntSize(vLits);
    vUsed = Vec_IntAlloc( Vec_IntSize(vLits) );
    while ( 1 )
    {
        int fChanges = 0;
        // derive SAT solver        
        pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
//        sat_solver_bookmark( pSat );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "Timeout reached after %d seconds.\n", nTimeOut );
            break;
        }
        if ( status == l_True )
        {
            printf( "The problem is satisfiable (the current set is not M-inductive).\n" );
            break;
        }
        assert( status == l_False );
        // call analize_final
        nLits = sat_solver_final( pSat, &pLits );
        // mark used literals
        Vec_IntFill( vUsed, Vec_IntSize(vLits), 0 );
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vUsed, Abc_Lit2Var(pLits[i]), 1 );

        // check if there are any positive unused
        Vec_IntForEachEntry( vLits, Lit, i )
        {
            assert( i == Abc_Lit2Var(Lit) );
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Vec_IntEntry(vUsed, i) )
                continue;
            // positive literal became unused
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Lit) );
            nLitsUsed--;
            fChanges = 1;
        }
        // report the results
        if ( fVerbose )
        printf( "M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        // count the number of negative literals
        sat_solver_delete( pSat );
        if ( !fChanges || fEmpty )
            break;
//        break;
//        sat_solver_rollback( pSat );
    }
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vLits );
    Vec_IntFree( vUsed );
}